

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

bool __thiscall S2Loop::Intersects(S2Loop *this,S2Loop *b)

{
  S2LatLngRect *this_00;
  S2LatLngRect *other;
  bool bVar1;
  S2Point *pSVar2;
  IntersectsRelation relation;
  LoopRelation local_68;
  char local_60;
  S2LatLngRect local_58;
  
  this_00 = &this->bound_;
  other = &b->bound_;
  bVar1 = S2LatLngRect::Intersects(this_00,other);
  if (!bVar1) {
    return false;
  }
  local_68._vptr_LoopRelation = (_func_int **)&PTR__LoopRelation_003055b0;
  local_60 = '\0';
  bVar1 = HasCrossingRelation(this,b,&local_68);
  if (bVar1) {
    return true;
  }
  if (local_60 != '\0') {
    return false;
  }
  bVar1 = S2LatLngRect::Contains(&this->subregion_bound_,other);
  if (!bVar1) {
    S2LatLngRect::Union(&local_58,this_00,other);
    bVar1 = S2LatLngRect::is_full(&local_58);
    if (!bVar1) goto LAB_0023cf04;
  }
  pSVar2 = vertex(b,0);
  bVar1 = Contains(this,pSVar2);
  if (bVar1) {
    return true;
  }
LAB_0023cf04:
  bVar1 = S2LatLngRect::Contains(&b->subregion_bound_,this_00);
  if (bVar1) {
    pSVar2 = vertex(this,0);
    bVar1 = Contains(b,pSVar2);
    if (bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool S2Loop::Intersects(const S2Loop* b) const {
  // a->Intersects(b) if and only if !a->Complement()->Contains(b).
  // This code is similar to Contains(), but is optimized for the case
  // where both loops enclose less than half of the sphere.
  if (!bound_.Intersects(b->bound_)) return false;

  // Check whether there are any edge crossings, and also check the loop
  // relationship at any shared vertices.
  IntersectsRelation relation;
  if (HasCrossingRelation(*this, *b, &relation)) return true;
  if (relation.found_shared_vertex()) return false;

  // Since there are no edge intersections or shared vertices, the loops
  // intersect only if A contains B, B contains A, or the two loops contain
  // each other's boundaries.  These checks are usually cheap because of the
  // bounding box preconditions.  Note that neither loop is empty (because of
  // the bounding box check above), so it is safe to access vertex(0).

  // Check whether A contains B, or A and B contain each other's boundaries.
  // (Note that A contains all the vertices of B in either case.)
  if (subregion_bound_.Contains(b->bound_) ||
      bound_.Union(b->bound_).is_full()) {
    if (Contains(b->vertex(0))) return true;
  }
  // Check whether B contains A.
  if (b->subregion_bound_.Contains(bound_)) {
    if (b->Contains(vertex(0))) return true;
  }
  return false;
}